

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall Generators_Stratified3D_Test::TestBody(Generators_Stratified3D_Test *this)

{
  undefined1 auVar1 [16];
  float fVar2;
  Tuple3<pbrt::Point3,_float> TVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  char *message;
  char *in_R9;
  float fVar8;
  undefined8 uVar10;
  undefined1 auVar9 [64];
  undefined1 extraout_var [56];
  Tuple3<pbrt::Point3,_float> TVar11;
  AssertionResult gtest_ar_;
  int count;
  Stratified3DIter __begin1;
  AssertHelper local_c0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  string local_a8;
  uint local_84;
  AssertHelper local_80;
  float local_74;
  Stratified3DIter local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  
  auVar9 = ZEXT3264(_DAT_0060f5c0);
  local_84 = 0;
  local_70._0_32_ = _DAT_0060f5c0;
  local_70.nz = 8;
  do {
    uVar4 = local_84;
    uVar10 = auVar9._8_8_;
    TVar11 = (Tuple3<pbrt::Point3,_float>)pbrt::detail::Stratified3DIter::operator*(&local_70);
    local_74 = TVar11.z;
    local_48 = TVar11._0_8_;
    fVar8 = TVar11.x;
    uStack_40 = uVar10;
    if ((float)(uVar4 & 3) * 0.25 <= fVar8) {
      fVar2 = (float)((uVar4 & 3) + 1) * 0.25;
      local_c0.data_._0_1_ = (internal)(fVar8 < fVar2);
      local_b8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (fVar2 <= fVar8) goto LAB_00358f25;
    }
    else {
      local_c0.data_._0_1_ = (internal)0x0;
LAB_00358f25:
      local_b8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(internal *)&local_c0,
                 (AssertionResult *)
                 "u[0] >= Float(ix) / Float(nx) && u[0] < Float(ix + 1) / Float(nx)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x490,(char *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                         local_a8._M_dataplus._M_p._0_4_));
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_) !=
          &local_a8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_),
                        local_a8.field_2._M_allocated_capacity + 1);
      }
      TVar11.z = local_74;
      TVar11.x = (float)(undefined4)local_48;
      TVar11.y = (float)local_48._4_4_;
      if (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        TVar3.z = local_74;
        TVar3.x = (float)(undefined4)local_48;
        TVar3.y = (float)local_48._4_4_;
        TVar11.z = local_74;
        TVar11.x = (float)(undefined4)local_48;
        TVar11.y = (float)local_48._4_4_;
        if ((bVar5) &&
           (TVar11 = TVar3,
           local_b0.ptr_ !=
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_b0.ptr_ + 8))();
          TVar11.z = local_74;
          TVar11.x = (float)(undefined4)local_48;
          TVar11.y = (float)local_48._4_4_;
        }
      }
    }
    local_74 = TVar11.z;
    local_48 = TVar11._0_8_;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    auVar1._8_8_ = uStack_40;
    auVar1._0_8_ = local_48;
    auVar1 = vmovshdup_avx(auVar1);
    uVar6 = uVar4 >> 2 & 0x1f;
    fVar8 = auVar1._0_4_;
    if ((float)uVar6 * 0.03125 <= fVar8) {
      fVar2 = (float)(uVar6 + 1) * 0.03125;
      local_c0.data_._0_1_ = (internal)(fVar8 < fVar2);
      local_b8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (fVar2 <= fVar8) goto LAB_00359023;
    }
    else {
      local_c0.data_._0_1_ = (internal)0x0;
LAB_00359023:
      local_b8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(internal *)&local_c0,
                 (AssertionResult *)
                 "u[1] >= Float(iy) / Float(ny) && u[1] < Float(iy + 1) / Float(ny)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x491,(char *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                         local_a8._M_dataplus._M_p._0_4_));
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_) !=
          &local_a8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_),
                        local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           (local_b0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_b0.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    fVar8 = (float)(uVar4 >> 7) * 0.125;
    auVar9 = ZEXT464((uint)fVar8);
    if (fVar8 <= local_74) {
      fVar8 = (float)((uVar4 >> 7) + 1) * 0.125;
      auVar9 = ZEXT464((uint)fVar8);
      local_c0.data_._0_1_ = (internal)(local_74 < fVar8);
      local_b8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (fVar8 <= local_74) goto LAB_0035911a;
    }
    else {
      local_c0.data_._0_1_ = (internal)0x0;
LAB_0035911a:
      local_b8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(internal *)&local_c0,
                 (AssertionResult *)
                 "u[2] >= Float(iz) / Float(nz) && u[2] < Float(iz + 1) / Float(nz)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x492,(char *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                         local_a8._M_dataplus._M_p._0_4_));
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_) !=
          &local_a8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_),
                        local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           (local_b0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          auVar9._0_8_ = (**(code **)(*(long *)local_b0.ptr_ + 8))();
          auVar9._8_56_ = extraout_var;
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_84 = uVar4 + 1;
    iVar7 = local_70.super_RNGIterator<pbrt::detail::Stratified3DIter>.
            super_IndexingIterator<pbrt::detail::Stratified3DIter>.i + 1;
    local_70.super_RNGIterator<pbrt::detail::Stratified3DIter>.
    super_IndexingIterator<pbrt::detail::Stratified3DIter>.i = iVar7;
    if (iVar7 == 0x400) {
      local_a8._M_dataplus._M_p._0_4_ = 0x400;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_70,"nx * ny * nz","count",(int *)&local_a8,(int *)&local_84);
      if (local_70.super_RNGIterator<pbrt::detail::Stratified3DIter>.
          super_IndexingIterator<pbrt::detail::Stratified3DIter>.i._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_a8);
        if ((undefined8 *)local_70.super_RNGIterator<pbrt::detail::Stratified3DIter>.rng.state ==
            (undefined8 *)0x0) {
          message = "";
        }
        else {
          message = *(char **)local_70.super_RNGIterator<pbrt::detail::Stratified3DIter>.rng.state;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x495,message);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_) != 0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) &&
             ((long *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                           local_a8._M_dataplus._M_p._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&local_70 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
  } while( true );
}

Assistant:

TEST(Generators, Stratified3D) {
    int count = 0, nx = 4, ny = 32, nz = 8;  // power of 2
    for (Point3f u : Stratified3D(nx, ny, nz)) {
        int ix = count % nx;
        int iy = (count / nx) % ny;
        int iz = count / (nx * ny);
        EXPECT_TRUE(u[0] >= Float(ix) / Float(nx) && u[0] < Float(ix + 1) / Float(nx));
        EXPECT_TRUE(u[1] >= Float(iy) / Float(ny) && u[1] < Float(iy + 1) / Float(ny));
        EXPECT_TRUE(u[2] >= Float(iz) / Float(nz) && u[2] < Float(iz + 1) / Float(nz));
        ++count;
    }
    EXPECT_EQ(nx * ny * nz, count);
}